

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sql.c
# Opt level: O0

int __thiscall CSQLInterface::Insert(CSQLInterface *this,char *pquery,...)

{
  int iVar1;
  char *in_RCX;
  undefined8 in_RDX;
  char *in_RSI;
  undefined8 in_RDI;
  CSQLInterface *in_R8;
  va_list arglist;
  TString tquery;
  TString query;
  undefined4 in_stack_ffffffffffffeee8;
  undefined4 in_stack_ffffffffffffeeec;
  TString *in_stack_ffffffffffffeef0;
  TString *in_stack_ffffffffffffeef8;
  undefined1 local_10f8 [16];
  undefined8 local_10e8;
  __va_list_tag local_1048;
  TString local_1020;
  TString local_818;
  char *local_10;
  undefined8 local_8;
  
  local_10e8 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  TString::TString(&local_818);
  TString::TString(&local_1020);
  local_1048.reg_save_area = local_10f8;
  local_1048.overflow_arg_area = &stack0x00000008;
  local_1048.fp_offset = 0x30;
  local_1048.gp_offset = 0x10;
  TString::Format(&local_818,&local_1048,local_10);
  TString::operator=(in_stack_ffffffffffffeef8,(char *)in_stack_ffffffffffffeef0);
  TString::operator_cast_to_char_(&local_818);
  TString::operator+=(in_stack_ffffffffffffeef0,
                      (char *)CONCAT44(in_stack_ffffffffffffeeec,in_stack_ffffffffffffeee8));
  TString::operator_cast_to_char_(&local_1020);
  iVar1 = IQuery(in_R8,in_RCX);
  TString::~TString(&local_1020);
  TString::~TString(&local_818);
  return iVar1;
}

Assistant:

int CSQLInterface::Insert(const char *pquery, ...)
{
	TString query, tquery;
	
	MUNCH_VARARG(pquery, query)

	tquery = "INSERT INTO ";
	tquery += (const char *)query;
	return IQuery(tquery);
}